

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O3

time_t __thiscall tsip::get_gps_time_utc(tsip *this)

{
  uint uVar1;
  undefined1 auVar2 [13];
  _command_packet _cmd;
  _command_packet _cmd_00;
  undefined1 auVar3 [13];
  bool bVar4;
  time_t tVar5;
  long lVar6;
  _command_packet *p_Var7;
  undefined8 *puVar8;
  byte bVar9;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6c [60];
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  undefined8 local_30;
  int local_28;
  char *local_18;
  
  bVar9 = 0;
  *(undefined2 *)&this->m_command = 0xa28e;
  (this->m_command).raw.data[2] = '\x03';
  (this->m_command).raw.cmd_len = '\x03';
  p_Var7 = &this->m_command;
  puVar8 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *(undefined8 *)p_Var7;
    p_Var7 = (_command_packet *)((long)p_Var7 + 8);
    puVar8 = puVar8 + 1;
  }
  _cmd._4_60_ = in_stack_ffffffffffffff6c;
  _cmd._0_4_ = in_stack_ffffffffffffff68;
  _cmd._64_4_ = *(undefined4 *)((long)&this->m_command + 0x40);
  send_request_msg(this,_cmd);
  *(undefined2 *)&this->m_command = 0xab8e;
  (this->m_command).raw.cmd_len = '\x02';
  p_Var7 = &this->m_command;
  puVar8 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *(undefined8 *)p_Var7;
    p_Var7 = (_command_packet *)((long)p_Var7 + (ulong)bVar9 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  _cmd_00._4_60_ = in_stack_ffffffffffffff6c;
  _cmd_00._0_4_ = in_stack_ffffffffffffff68;
  _cmd_00._64_4_ = *(undefined4 *)((long)&this->m_command + 0x40);
  bVar4 = get_report_msg(this,_cmd_00);
  if (bVar4) {
    local_18 = "UTC";
    local_30._0_4_ = -1;
    local_30._4_4_ = -1;
    local_28 = -1;
    local_34 = (this->m_primary_time).report.year - 0x76c;
    local_38 = (this->m_primary_time).report.month - 1;
    uVar1._0_1_ = (this->m_primary_time).report.seconds;
    uVar1._1_1_ = (this->m_primary_time).report.minutes;
    uVar1._2_1_ = (this->m_primary_time).report.hours;
    uVar1._3_1_ = (this->m_primary_time).report.day;
    auVar2[0xc] = uVar1._3_1_;
    auVar2._0_12_ = ZEXT712(0);
    auVar3[1] = 0;
    auVar3[0] = uVar1._2_1_;
    auVar3._2_3_ = auVar2._10_3_;
    auVar3._5_8_ = 0;
    local_48[5] = 0;
    local_48[4] = uVar1._1_1_;
    local_48._6_7_ = SUB137(auVar3 << 0x40,6);
    local_48._0_4_ = uVar1 & 0xff;
    local_48._13_3_ = 0;
    tVar5 = timegm((tm *)local_48);
    this->gps_time = tVar5;
    if (this->verbose == true) {
      printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n",
             (ulong)local_34,(ulong)local_38,(ulong)(uint)local_48._12_4_,
             (ulong)(uint)local_48._8_4_,(ulong)(uint)local_48._4_4_);
      printf("seconds: %d\n",this->gps_time);
      tVar5 = this->gps_time;
    }
    return tVar5;
  }
  puts("****Failed to get GPS time****");
  exit(0);
}

Assistant:

time_t tsip::get_gps_time_utc() {
	bool rc;

	//build a2 request - set UTC
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_UTC_GPS_TIME;
	m_command.extended.data[0] = 0x3;
	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);

	//build ab request - request time packet
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_PRIMARY_TIME;
	m_command.extended.cmd_len  = 2;
	rc = get_report_msg(m_command);
	if (!rc) {
		printf("****Failed to get GPS time****\n");
		exit (false);
    }


	struct tm time;

    time.tm_zone = "UTC";
    time.tm_wday = -1;
    time.tm_yday = -1;
    time.tm_isdst = -1;
    time.tm_year = m_primary_time.report.year - 1900;
    time.tm_mon = m_primary_time.report.month - 1;
    time.tm_mday = m_primary_time.report.day;
    time.tm_hour = m_primary_time.report.hours;
    time.tm_min = m_primary_time.report.minutes;
    time.tm_sec = m_primary_time.report.seconds;

    gps_time = timegm(&time);
    if (verbose) {
		printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n", time.tm_year, time.tm_mon, time.tm_mday, time.tm_hour, time.tm_min, time.tm_sec);
		printf("seconds: %d\n", gps_time);
    }

	return gps_time;
}